

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  stbi_uc *psVar10;
  float fVar11;
  double dVar12;
  
  if (data != (float *)0x0) {
    psVar3 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar3 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar8 = ((comp & 1U) + comp) - 1;
        lVar7 = (long)comp;
        uVar6 = 0;
        pfVar5 = data;
        psVar10 = psVar3;
        do {
          uVar2 = 0;
          if (0 < (int)uVar8) {
            uVar9 = 0;
            do {
              dVar12 = pow((double)(pfVar5[uVar9] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
              fVar11 = (float)dVar12 * 255.0 + 0.5;
              fVar1 = 0.0;
              if (0.0 <= fVar11) {
                fVar1 = fVar11;
              }
              fVar11 = 255.0;
              if (fVar1 <= 255.0) {
                fVar11 = fVar1;
              }
              psVar10[uVar9] = (stbi_uc)(int)fVar11;
              uVar9 = uVar9 + 1;
              uVar2 = uVar8;
            } while (uVar8 != uVar9);
          }
          if ((int)uVar2 < comp) {
            lVar4 = (ulong)uVar2 + uVar6 * lVar7;
            fVar11 = data[lVar4] * 255.0 + 0.5;
            fVar1 = 0.0;
            if (0.0 <= fVar11) {
              fVar1 = fVar11;
            }
            fVar11 = 255.0;
            if (fVar1 <= 255.0) {
              fVar11 = fVar1;
            }
            psVar3[lVar4] = (stbi_uc)(int)fVar11;
          }
          uVar6 = uVar6 + 1;
          pfVar5 = pfVar5 + lVar7;
          psVar10 = psVar10 + lVar7;
        } while (uVar6 != (uint)(y * x));
      }
      free(data);
      return psVar3;
    }
    free(data);
    stbi__g_failure_reason = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}